

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

int Gia_ManSopToAig(Gia_Man_t *p,char *pSop,Vec_Int_t *vLeaves)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  int iLit1;
  uint iLit0;
  uint iLit1_00;
  char *pcVar4;
  long lVar5;
  
  iVar3 = Kit_PlaGetVarNum(pSop);
  if (*pSop == '\0') {
    iLit0 = 0;
  }
  else {
    iLit0 = 0;
    pcVar4 = pSop;
    do {
      iLit1 = 1;
      for (lVar5 = 0; bVar2 = pcVar4[lVar5], (bVar2 & 0xdf) != 0; lVar5 = lVar5 + 1) {
        if (vLeaves->nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iLit1_00 = vLeaves->pArray[lVar5];
        if ((int)iLit1_00 < 0) {
          __assert_fail("Vec_IntEntry(vLeaves, i) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                        ,0x54,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
        }
        if (bVar2 != 0x2d) {
          if (bVar2 != 0x31) {
            if (bVar2 != 0x30) {
              __assert_fail("Value == \'-\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                            ,0x59,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
            }
            iLit1_00 = iLit1_00 ^ 1;
          }
          iLit1 = Gia_ManHashAnd(p,iLit1,iLit1_00);
        }
      }
      iLit0 = Gia_ManHashOr(p,iLit0,iLit1);
      pcVar1 = pcVar4 + (iVar3 + 3);
      pcVar4 = pcVar4 + (iVar3 + 3);
    } while (*pcVar1 != '\0');
  }
  iVar3 = Kit_PlaIsComplement(pSop);
  if (iVar3 != 0) {
    if ((int)iLit0 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    iLit0 = iLit0 ^ 1;
  }
  return iLit0;
}

Assistant:

int Gia_ManSopToAig( Gia_Man_t * p, char * pSop, Vec_Int_t * vLeaves )
{
    int i, iAnd, iSum, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Kit_PlaGetVarNum(pSop);
    // go through the cubes of the node's SOP
    iSum = 0;
    Kit_PlaForEachCube( pSop, nFanins, pCube )
    {
        // create the AND of literals
        iAnd = 1;
        Kit_PlaCubeForEachVar( pCube, Value, i )
        {
            assert( Vec_IntEntry(vLeaves, i) >= 0 );
            if ( Value == '1' )
                iAnd = Gia_ManHashAnd( p, iAnd, Vec_IntEntry(vLeaves, i) );
            else if ( Value == '0' )
                iAnd = Gia_ManHashAnd( p, iAnd, Abc_LitNot(Vec_IntEntry(vLeaves, i)) );
            else assert( Value == '-' );
        }
        // add to the sum of cubes
        iSum = Gia_ManHashOr( p, iSum, iAnd );
    }
    // decide whether to complement the result
    if ( Kit_PlaIsComplement(pSop) )
        iSum = Abc_LitNot(iSum);
    return iSum;
}